

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskWriteCase::init
          (SampleMaskWriteCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_320;
  MessageBuilder local_190;
  SampleMaskWriteCase *local_10;
  SampleMaskWriteCase *this_local;
  
  local_10 = this;
  if (*(int *)&(this->super_SampleMaskBaseCase).field_0x12c == 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_190,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_190,
                        (char (*) [64])
                        "Discarding half of the samples using gl_SampleMask, expecting:\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [60])
                               "\t1) half intensity on multisample targets (numSamples > 1)\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [59])
                               "\t2) full discard on multisample targets (numSamples == 1)\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [109])
                               "\t3) full intensity (no discard) on singlesample targets. (Mask is only applied as a multisample operation.)\n"
                       );
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  else if (*(int *)&(this->super_SampleMaskBaseCase).field_0x12c == 1) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_320,
                        (char (*) [126])
                        "Discarding half of the samples using GL_SAMPLE_MASK, setting inverse mask in fragment shader using gl_SampleMask, expecting:\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [71])
                               "\t1) full discard on multisample targets (mask & modifiedCoverge == 0)\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [122])
                               "\t2) full intensity (no discard) on singlesample targets. (Mask and coverage is only applied as a multisample operation.)\n"
                       );
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
  }
  iVar1 = SampleMaskBaseCase::init(&this->super_SampleMaskBaseCase,ctx);
  return iVar1;
}

Assistant:

void SampleMaskWriteCase::init (void)
{
	// log the test method and expectations
	if (m_testMode == TEST_DISCARD)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Discarding half of the samples using gl_SampleMask, expecting:\n"
			<< "	1) half intensity on multisample targets (numSamples > 1)\n"
			<< "	2) full discard on multisample targets (numSamples == 1)\n"
			<< "	3) full intensity (no discard) on singlesample targets. (Mask is only applied as a multisample operation.)\n"
			<< tcu::TestLog::EndMessage;
	else if (m_testMode == TEST_INVERSE)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Discarding half of the samples using GL_SAMPLE_MASK, setting inverse mask in fragment shader using gl_SampleMask, expecting:\n"
			<< "	1) full discard on multisample targets (mask & modifiedCoverge == 0)\n"
			<< "	2) full intensity (no discard) on singlesample targets. (Mask and coverage is only applied as a multisample operation.)\n"
			<< tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	SampleMaskBaseCase::init();
}